

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_predset(DisasContext_conflict1 *s,int esz,int rd,int pat,_Bool setflag)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint fullsz_00;
  uint dofs;
  uint32_t maxsz_00;
  uint32_t oprsz_00;
  TCGv_i64 ret;
  uint oprsz;
  uint maxsz;
  TCGv_i64 t;
  uint64_t lastword;
  uint64_t word;
  uint local_40;
  uint i;
  uint setsz;
  uint numelem;
  uint ofs;
  uint fullsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool setflag_local;
  int pat_local;
  int rd_local;
  int esz_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (!_Var1) {
    return true;
  }
  fullsz_00 = vec_full_reg_size(s);
  dofs = pred_full_reg_offset(s,rd);
  local_40 = decode_pred_count(fullsz_00,pat,esz);
  if (local_40 == 0) {
    lastword = 0;
    t = (TCGv_i64)0x0;
    local_40 = fullsz_00;
  }
  else {
    local_40 = local_40 << ((byte)esz & 0x1f);
    lastword = pred_esz_masks_aarch64[esz];
    t = (TCGv_i64)lastword;
    if ((local_40 & 0x3f) != 0) {
      t = (TCGv_i64)(0xffffffffffffffffU >> (0x40 - ((byte)local_40 & 0x3f) & 0x3f) & lastword);
    }
  }
  ret = tcg_temp_new_i64(tcg_ctx_00);
  if (fullsz_00 < 0x41) {
    tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret,(int64_t)t);
    tcg_gen_st_i64_aarch64(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,(ulong)dofs);
  }
  else {
    if ((TCGv_i64)lastword == t) {
      maxsz_00 = size_for_gvec(fullsz_00 >> 3);
      oprsz_00 = size_for_gvec(local_40 >> 3);
      if (oprsz_00 << 3 == local_40) {
        tcg_gen_gvec_dup64i_aarch64(tcg_ctx_00,dofs,oprsz_00,maxsz_00,lastword);
        goto LAB_007db0dc;
      }
    }
    tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret,lastword);
    for (word._4_4_ = 0; word._4_4_ < (local_40 >> 3 & 0xfffffff8); word._4_4_ = word._4_4_ + 8) {
      tcg_gen_st_i64_aarch64(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,(ulong)(dofs + word._4_4_));
    }
    if (t != (TCGv_i64)lastword) {
      tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret,(int64_t)t);
      tcg_gen_st_i64_aarch64(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,(ulong)(dofs + word._4_4_));
      word._4_4_ = word._4_4_ + 8;
    }
    if (word._4_4_ < fullsz_00 >> 3) {
      tcg_gen_movi_i64_aarch64(tcg_ctx_00,ret,0);
      for (; word._4_4_ < fullsz_00 >> 3; word._4_4_ = word._4_4_ + 8) {
        tcg_gen_st_i64_aarch64(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,(ulong)(dofs + word._4_4_));
      }
    }
  }
LAB_007db0dc:
  tcg_temp_free_i64(tcg_ctx_00,ret);
  if (setflag) {
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_NF,-(uint)(lastword != 0));
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_CF,(uint)(lastword == 0));
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_VF,0);
    tcg_gen_mov_i32(tcg_ctx_00,tcg_ctx_00->cpu_ZF,tcg_ctx_00->cpu_NF);
  }
  return true;
}

Assistant:

static bool do_predset(DisasContext *s, int esz, int rd, int pat, bool setflag)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned fullsz = vec_full_reg_size(s);
    unsigned ofs = pred_full_reg_offset(s, rd);
    unsigned numelem, setsz, i;
    uint64_t word, lastword;
    TCGv_i64 t;

    numelem = decode_pred_count(fullsz, pat, esz);

    /* Determine what we must store into each bit, and how many.  */
    if (numelem == 0) {
        lastword = word = 0;
        setsz = fullsz;
    } else {
        setsz = numelem << esz;
        lastword = word = pred_esz_masks[esz];
        if (setsz % 64) {
            lastword &= MAKE_64BIT_MASK(0, setsz % 64);
        }
    }

    t = tcg_temp_new_i64(tcg_ctx);
    if (fullsz <= 64) {
        tcg_gen_movi_i64(tcg_ctx, t, lastword);
        tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs);
        goto done;
    }

    if (word == lastword) {
        unsigned maxsz = size_for_gvec(fullsz / 8);
        unsigned oprsz = size_for_gvec(setsz / 8);

        if (oprsz * 8 == setsz) {
            tcg_gen_gvec_dup64i(tcg_ctx, ofs, oprsz, maxsz, word);
            goto done;
        }
    }

    setsz /= 8;
    fullsz /= 8;

    tcg_gen_movi_i64(tcg_ctx, t, word);
    for (i = 0; i < QEMU_ALIGN_DOWN(setsz, 8); i += 8) {
        tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs + i);
    }
    if (lastword != word) {
        tcg_gen_movi_i64(tcg_ctx, t, lastword);
        tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs + i);
        i += 8;
    }
    if (i < fullsz) {
        tcg_gen_movi_i64(tcg_ctx, t, 0);
        for (; i < fullsz; i += 8) {
            tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs + i);
        }
    }

 done:
    tcg_temp_free_i64(tcg_ctx, t);

    /* PTRUES */
    if (setflag) {
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_NF, -(word != 0));
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_CF, word == 0);
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_VF, 0);
        tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_ZF, tcg_ctx->cpu_NF);
    }
    return true;
}